

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O0

int fQ(sunrealtype t,N_Vector y,N_Vector qdot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  void *user_data_local;
  N_Vector qdot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = **(double **)((long)y->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  **(double **)((long)qdot->content + 0x10) = (dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 0.5;
  return 0;
}

Assistant:

static int fQ(sunrealtype t, N_Vector y, N_Vector qdot, void* user_data)
{
  sunrealtype y1, y2, y3;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  Ith(qdot, 1) = 0.5 * (y1 * y1 + y2 * y2 + y3 * y3);

  return (0);
}